

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

void Kit_DsdRotate(Kit_DsdNtk_t *p,int *pFreqs)

{
  uint *puVar1;
  ushort uVar2;
  Kit_DsdObj_t KVar3;
  int iVar4;
  Kit_DsdObj_t *pKVar5;
  ushort uVar6;
  uint *pOut;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint *pIn;
  bool bVar14;
  int Weights [16];
  int aiStack_78 [18];
  
  uVar13 = (ulong)p->nNodes;
  if (p->nNodes != 0) {
    uVar12 = 0;
    do {
      pKVar5 = p->pNodes[uVar12];
      if (pKVar5 == (Kit_DsdObj_t *)0x0) {
        return;
      }
      KVar3 = *pKVar5;
      if (((uint)KVar3 & 0x1c0) == 0x140) {
        if (0x3ffffff < (uint)KVar3) {
          uVar2 = p->nVars;
          uVar10 = 0;
          do {
            uVar6 = *(ushort *)((long)&pKVar5[1].field_0x0 + uVar10 * 2) >> 1;
            if ((int)uVar13 + (uint)uVar2 <= (uint)uVar6) {
              __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                            ,0x9c,"unsigned int Kit_DsdLitSupport(Kit_DsdNtk_t *, int)");
            }
            if (p->pSupps == (uint *)0x0) {
              uVar11 = 0;
            }
            else if (uVar6 < uVar2) {
              uVar11 = 1 << ((byte)uVar6 & 0x1f);
            }
            else {
              uVar11 = p->pSupps[(ulong)(uint)uVar6 - (ulong)uVar2];
            }
            aiStack_78[uVar10] = 0;
            lVar7 = 0;
            do {
              if ((uVar11 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
                aiStack_78[uVar10] = pFreqs[lVar7] + aiStack_78[uVar10] + -1;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != 0x10);
            uVar10 = uVar10 + 1;
          } while (uVar10 != (uint)KVar3 >> 0x1a);
        }
        uVar13 = 0xffffffff;
        if (0x3ffffff < (uint)KVar3) {
          uVar10 = 0;
          uVar13 = 0xffffffff;
          iVar8 = 0;
          do {
            iVar4 = aiStack_78[uVar10];
            iVar9 = iVar8;
            if (iVar8 <= iVar4) {
              iVar9 = iVar4;
            }
            if (iVar8 < iVar4) {
              uVar13 = uVar10 & 0xffffffff;
            }
            uVar10 = uVar10 + 1;
            iVar8 = iVar9;
          } while ((uint)KVar3 >> 0x1a != uVar10);
        }
        iVar8 = (int)uVar13;
        if (iVar8 != -1) {
          pOut = (uint *)((long)&pKVar5[1].field_0x0 + (ulong)((uint)KVar3 >> 8 & 0x3fc));
          pIn = p->pMem;
          if (iVar8 < 1) {
            bVar14 = true;
          }
          else {
            lVar7 = (long)&pKVar5[1].field_0x0 + uVar13 * 2;
            puVar1 = pOut;
            do {
              pOut = pIn;
              pIn = puVar1;
              iVar8 = iVar8 + -1;
              puVar1 = (uint *)(lVar7 + -2);
              *puVar1 = *puVar1 << 0x10 | *puVar1 >> 0x10;
              lVar7 = lVar7 + -2;
              Kit_TruthSwapAdjacentVars(pOut,pIn,(uint)*pKVar5 >> 0x1a,iVar8);
              puVar1 = pOut;
            } while (iVar8 != 0);
            bVar14 = (uVar13 & 1) == 0;
          }
          if (!bVar14) {
            uVar11 = 1 << ((SUB41(*pKVar5,3) >> 2) - 5 & 0x1f);
            if ((uint)*pKVar5 < 0x18000000) {
              uVar11 = 1;
            }
            if (0 < (int)uVar11) {
              lVar7 = (ulong)uVar11 + 1;
              do {
                pIn[lVar7 + -2] = pOut[lVar7 + -2];
                lVar7 = lVar7 + -1;
              } while (1 < lVar7);
            }
          }
        }
      }
      uVar12 = uVar12 + 1;
      uVar13 = (ulong)p->nNodes;
    } while (uVar12 < uVar13);
  }
  return;
}

Assistant:

void Kit_DsdRotate( Kit_DsdNtk_t * p, int pFreqs[] )
{
    Kit_DsdObj_t * pObj;
    unsigned * pIn, * pOut, * pTemp, k;
    int i, v, Temp, uSuppFanin, iFaninLit, WeightMax, FaninMax, nSwaps;
    int Weights[16];
    // go through the prime nodes
    Kit_DsdNtkForEachObj( p, pObj, i )
    {
        if ( pObj->Type != KIT_DSD_PRIME )
            continue;
        // count the fanin frequencies
        Kit_DsdObjForEachFanin( p, pObj, iFaninLit, k )
        {
            uSuppFanin = Kit_DsdLitSupport( p, iFaninLit );
            Weights[k] = 0;
            for ( v = 0; v < 16; v++ )
                if ( uSuppFanin & (1 << v) )
                    Weights[k] += pFreqs[v] - 1;
        }
        // find the most frequent fanin
        WeightMax = 0; 
        FaninMax = -1;
        for ( k = 0; k < pObj->nFans; k++ )
            if ( WeightMax < Weights[k] )
            {
                WeightMax = Weights[k];
                FaninMax = k;
            }
        // no need to reorder if there are no frequent fanins
        if ( FaninMax == -1 )
            continue;
        // move the fanins number k to the first place
        nSwaps = 0;
        pIn = Kit_DsdObjTruth(pObj);
        pOut = p->pMem;
//        for ( v = FaninMax; v < ((int)pObj->nFans)-1; v++ )
        for ( v = FaninMax-1; v >= 0; v-- )
        {
            // swap the fanins
            Temp = pObj->pFans[v];
            pObj->pFans[v] = pObj->pFans[v+1];
            pObj->pFans[v+1] = Temp;
            // swap the truth table variables
            Kit_TruthSwapAdjacentVars( pOut, pIn, pObj->nFans, v );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
            nSwaps++;
        }
        if ( nSwaps & 1 )
            Kit_TruthCopy( pOut, pIn, pObj->nFans );
    }    
}